

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scheme.cpp
# Opt level: O0

bool implementations::scheme::SchemeDispatcher<(implementations::scheme::instruction::instruction)1>
     ::dispatch(SchemeFrame *frame,const_iterator it)

{
  cell *this;
  bool bVar1;
  cell *local_a8;
  cell local_90;
  cell *local_38;
  cell *if_result;
  cell *test;
  cell *alt;
  cell *conseq;
  SchemeFrame *frame_local;
  const_iterator it_local;
  
  conseq = (cell *)frame;
  frame_local = (SchemeFrame *)it._M_current;
  alt = __gnu_cxx::
        __normal_iterator<const_implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
        ::operator*((__normal_iterator<const_implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
                     *)&frame_local);
  __gnu_cxx::
  __normal_iterator<const_implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
  ::operator++((__normal_iterator<const_implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
                *)&frame_local);
  test = __gnu_cxx::
         __normal_iterator<const_implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
         ::operator*((__normal_iterator<const_implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
                      *)&frame_local);
  __gnu_cxx::
  __normal_iterator<const_implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
  ::operator++((__normal_iterator<const_implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
                *)&frame_local);
  if_result = __gnu_cxx::
              __normal_iterator<const_implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
              ::operator*((__normal_iterator<const_implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
                           *)&frame_local);
  __gnu_cxx::
  __normal_iterator<const_implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
  ::operator++((__normal_iterator<const_implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
                *)&frame_local);
  bVar1 = std::operator==(&if_result->val,"#t");
  this = conseq;
  if (bVar1) {
    local_a8 = alt;
  }
  else {
    local_a8 = test;
  }
  local_38 = local_a8;
  cell::cell(&local_90,local_a8);
  SchemeFrame::setExpression((SchemeFrame *)this,&local_90);
  cell::~cell(&local_90);
  return false;
}

Assistant:

static bool dispatch(SchemeFrame &frame, cells::const_iterator it) {
		const cell &conseq = *it; ++it;
		const cell &alt = *it; ++it;
		const cell &test = *it; ++it;
		const cell &if_result = (test.val == "#t") ? conseq : alt;
		frame.setExpression(cell(if_result));
		// Don't move exp_it
		return false;
	}